

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_ws_handshake(lws *wsi)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  uchar *buf_00;
  uchar *end_00;
  char *pcVar4;
  uchar *puVar5;
  size_t sVar6;
  ulong len;
  lws_http_mount *plVar7;
  int n;
  size_t m;
  char *uri_ptr;
  lws_http_mount *hit;
  uint8_t *end;
  uint8_t *start;
  uint8_t *p;
  uint8_t buf [2064];
  lws *wsi_local;
  
  buf_00 = buf + 8;
  end_00 = buf + 0x807;
  start = buf_00;
  buf._2056_8_ = wsi;
  iVar2 = lws_add_http_header_status(wsi,200,&start,end_00);
  if (iVar2 == 0) {
    iVar2 = lws_hdr_total_length((lws *)buf._2056_8_,WSI_TOKEN_PROTOCOL);
    if (iVar2 < 0x41) {
      if (((*(ulong *)(buf._2056_8_ + 0x46e) >> 0x26 & 1) == 0) ||
         (*(long *)(buf._2056_8_ + 0x350) == 0)) {
        iVar2 = lws_hdr_total_length((lws *)buf._2056_8_,WSI_TOKEN_PROTOCOL);
        uVar1 = buf._2056_8_;
        if ((iVar2 != 0) &&
           ((**(long **)(buf._2056_8_ + 0x10) != 0 &&
            (*(char *)**(undefined8 **)(buf._2056_8_ + 0x10) != '\0')))) {
          puVar5 = (uchar *)**(undefined8 **)(buf._2056_8_ + 0x10);
          sVar6 = strlen((char *)**(undefined8 **)(buf._2056_8_ + 0x10));
          iVar2 = lws_add_http_header_by_token
                            ((lws *)uVar1,WSI_TOKEN_PROTOCOL,puVar5,(int)sVar6,&start,end_00);
          if (iVar2 != 0) {
            return -1;
          }
        }
      }
      else {
        pcVar4 = lws_hdr_simple_ptr((lws *)buf._2056_8_,WSI_TOKEN_PROTOCOL);
        uVar1 = buf._2056_8_;
        if (pcVar4 != (char *)0x0) {
          puVar5 = (uchar *)lws_hdr_simple_ptr((lws *)buf._2056_8_,WSI_TOKEN_PROTOCOL);
          pcVar4 = lws_hdr_simple_ptr((lws *)buf._2056_8_,WSI_TOKEN_PROTOCOL);
          sVar6 = strlen(pcVar4);
          iVar2 = lws_add_http_header_by_token
                            ((lws *)uVar1,WSI_TOKEN_PROTOCOL,puVar5,(int)sVar6,&start,end_00);
          if (iVar2 != 0) {
            return -1;
          }
        }
      }
      iVar2 = lws_finalize_http_header((lws *)buf._2056_8_,&start,end_00);
      if (iVar2 == 0) {
        len = (long)start - (long)buf_00;
        uVar3 = lws_write((lws *)buf._2056_8_,buf_00,len,LWS_WRITE_HTTP_HEADERS);
        if (uVar3 == (uint)len) {
          lwsi_set_state((lws *)buf._2056_8_,0x119);
          *(undefined1 *)(buf._2056_8_ + 0x482) = 0;
          pcVar4 = lws_hdr_simple_ptr((lws *)buf._2056_8_,WSI_TOKEN_HTTP_COLON_PATH);
          iVar2 = lws_hdr_total_length((lws *)buf._2056_8_,WSI_TOKEN_HTTP_COLON_PATH);
          plVar7 = lws_find_mount((lws *)buf._2056_8_,pcVar4,iVar2);
          if (((plVar7 == (lws_http_mount *)0x0) ||
              (plVar7->cgienv == (lws_protocol_vhost_options *)0x0)) ||
             (iVar2 = (**(code **)(*(long *)(buf._2056_8_ + 0x10) + 8))
                                (buf._2056_8_,0x38,*(undefined8 *)(buf._2056_8_ + 0x3c8),
                                 plVar7->cgienv,0), iVar2 == 0)) {
            lws_validity_confirmed((lws *)buf._2056_8_);
            wsi_local._4_4_ = 0;
          }
          else {
            wsi_local._4_4_ = 1;
          }
        }
        else {
          _lws_log(1,"_write returned %d from %d\n",(ulong)uVar3,len & 0xffffffff);
          wsi_local._4_4_ = -1;
        }
      }
      else {
        wsi_local._4_4_ = -1;
      }
    }
    else {
      wsi_local._4_4_ = -1;
    }
  }
  else {
    wsi_local._4_4_ = -1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_h2_ws_handshake(struct lws *wsi)
{
	uint8_t buf[LWS_PRE + 2048], *p = buf + LWS_PRE, *start = p,
		*end = &buf[sizeof(buf) - 1];
	const struct lws_http_mount *hit;
	const char * uri_ptr;
	size_t m;
	int n;

	if (lws_add_http_header_status(wsi, HTTP_STATUS_OK, &p, end))
		return -1;

	if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) > 64)
		return -1;

	if (wsi->proxied_ws_parent && wsi->child_list) {
		if (lws_hdr_simple_ptr(wsi, WSI_TOKEN_PROTOCOL)) {
			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(uint8_t *)lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL),
				(int)strlen(lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL)),
						 &p, end))
			return -1;
		}
	} else {

		/* we can only return the protocol header if:
		 *  - one came in, and ... */
		if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) &&
		    /*  - it is not an empty string */
		    wsi->a.protocol->name && wsi->a.protocol->name[0]) {

#if defined(LWS_WITH_SECURE_STREAMS) && defined(LWS_WITH_SERVER)

		/*
		 * This is the h2 version of server-ws.c understanding that it
		 * did the ws upgrade on a ss server object, therefore it needs
		 * to pass back to the peer the policy ws-protocol name, not
		 * the generic ss-ws.c protocol name
		 */

		if (wsi->a.vhost && wsi->a.vhost->ss_handle &&
		    wsi->a.vhost->ss_handle->policy->u.http.u.ws.subprotocol) {
			lws_ss_handle_t *h =
				(lws_ss_handle_t *)wsi->a.opaque_user_data;

			lwsl_notice("%s: Server SS %s .wsi %s switching to ws protocol\n",
					__func__, lws_ss_tag(h), lws_wsi_tag(h->wsi));

			wsi->a.protocol = &protocol_secstream_ws;

			/*
			 * inform the SS user code that this has done a one-way
			 * upgrade to some other protocol... it will likely
			 * want to treat subsequent payloads differently
			 */

			lws_ss_event_helper(h, LWSSSCS_SERVER_UPGRADE);

			lws_mux_mark_immortal(wsi);

			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(unsigned char *)wsi->a.vhost->ss_handle->policy->
						u.http.u.ws.subprotocol,
				(int)strlen(wsi->a.vhost->ss_handle->policy->
						u.http.u.ws.subprotocol), &p, end))
					return -1;
		} else
#endif

			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(unsigned char *)wsi->a.protocol->name,
				(int)strlen(wsi->a.protocol->name), &p, end))
					return -1;
		}
	}

	if (lws_finalize_http_header(wsi, &p, end))
		return -1;

	m = lws_ptr_diff_size_t(p, start);
	// lwsl_hexdump_notice(start, m);
	n = lws_write(wsi, start, m, LWS_WRITE_HTTP_HEADERS);
	if (n != (int)m) {
		lwsl_err("_write returned %d from %d\n", n, (int)m);

		return -1;
	}

	/*
	 * alright clean up, set our state to generic ws established, the
	 * mode / state of the nwsi will get the h2 processing done.
	 */

	lwsi_set_state(wsi, LRS_ESTABLISHED);
	wsi->lws_rx_parse_state = 0; // ==LWS_RXPS_NEW;

	uri_ptr = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	n = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	hit = lws_find_mount(wsi, uri_ptr, n);

	if (hit && hit->cgienv &&
	    wsi->a.protocol->callback(wsi, LWS_CALLBACK_HTTP_PMO, wsi->user_space,
				    (void *)hit->cgienv, 0))
		return 1;

	lws_validity_confirmed(wsi);

	return 0;
}